

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void __thiscall clip_model_loader::alloc_compute_meta(clip_model_loader *this)

{
  value_type pgVar1;
  value_type pgVar2;
  pointer pcVar3;
  ggml_cgraph *pgVar4;
  pointer pgVar5;
  size_type sVar6;
  reference ppgVar7;
  reference ppgVar8;
  vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  *pvVar9;
  undefined8 uVar10;
  long in_RDI;
  undefined1 auVar11 [16];
  size_t size;
  ggml_backend_buffer_type_t buft;
  ggml_backend_t backend;
  size_t i;
  ggml_cgraph *gf;
  clip_image_size image_size;
  clip_image_f32_ptr img;
  clip_image_f32_batch batch;
  pointer in_stack_ffffffffffffff38;
  vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined1 is_inf;
  size_type sVar12;
  clip_image_f32_batch *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int iVar13;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff60;
  clip_image_size load_image_size;
  size_type local_58;
  undefined1 local_28 [32];
  
  is_inf = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38);
  ggml_tensor_overhead();
  ggml_graph_overhead();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffff60,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
            );
  clip_image_f32_batch::clip_image_f32_batch((clip_image_f32_batch *)0x1c3ba5);
  clip_image_f32_init();
  load_image_size = (clip_image_size)local_28;
  std::unique_ptr<clip_image_f32,clip_image_f32_deleter>::unique_ptr<clip_image_f32_deleter,void>
            ((unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  iVar13 = *(int *)(*(long *)(in_RDI + 0x10) + 0x10);
  iVar14 = *(int *)(*(long *)(in_RDI + 0x10) + 0x10);
  pcVar3 = std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::operator->
                     ((unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)0x1c3bfe);
  pcVar3->nx = iVar13;
  pcVar3 = std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::operator->
                     ((unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)0x1c3c19);
  pcVar3->ny = iVar14;
  std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::operator->
            ((unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)0x1c3c2a);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)load_image_size,CONCAT44(iVar14,iVar13));
  std::
  vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  ::push_back(in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
  pgVar4 = clip_image_build_graph
                     ((clip_ctx *)CONCAT44(iVar14,iVar13),in_stack_ffffffffffffff50,load_image_size,
                      (bool)is_inf);
  pgVar5 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                     ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
                      in_stack_ffffffffffffff40);
  ggml_backend_sched_reserve(pgVar5,pgVar4);
  local_58 = 0;
  while (sVar12 = local_58,
        sVar6 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::size
                          ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)
                           (*(long *)(in_RDI + 0x10) + 0x350)), sVar12 < sVar6) {
    ppgVar7 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::operator[]
                        ((vector<ggml_backend_*,_std::allocator<ggml_backend_*>_> *)
                         (*(long *)(in_RDI + 0x10) + 0x350),local_58);
    pgVar1 = *ppgVar7;
    ppgVar8 = std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::
              operator[]((vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
                          *)(*(long *)(in_RDI + 0x10) + 0x368),local_58);
    pgVar2 = *ppgVar8;
    pgVar5 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                       ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
                        in_stack_ffffffffffffff40);
    pvVar9 = (vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
              *)ggml_backend_sched_get_buffer_size(pgVar5,pgVar1);
    in_stack_ffffffffffffff40 = pvVar9;
    if (((vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
          *)0x1 < pvVar9) && ((int)g_logger_state.verbosity_thold < 3)) {
      uVar10 = ggml_backend_buft_name(pgVar2);
      auVar11._8_4_ = (int)((ulong)pvVar9 >> 0x20);
      auVar11._0_8_ = pvVar9;
      auVar11._12_4_ = 0x45300000;
      clip_log_internal((ggml_log_level)
                        (((auVar11._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)pvVar9) - 4503599627370496.0)) *
                         0.0009765625 * 0.0009765625),(char *)0x2,
                        "%s: %10s compute buffer size = %8.2f MiB\n","alloc_compute_meta",uVar10);
    }
    local_58 = local_58 + 1;
  }
  std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::~unique_ptr
            ((unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)in_stack_ffffffffffffff40);
  clip_image_f32_batch::~clip_image_f32_batch((clip_image_f32_batch *)0x1c3e7d);
  return;
}

Assistant:

void alloc_compute_meta() {
        ctx_clip.buf_compute_meta.resize(ctx_clip.max_nodes * ggml_tensor_overhead() + ggml_graph_overhead());

        // create a fake batch
        clip_image_f32_batch batch;
        clip_image_f32_ptr img(clip_image_f32_init());
        clip_image_size image_size;
        image_size.width  = ctx_clip.vision_model.hparams.image_size;
        image_size.height = ctx_clip.vision_model.hparams.image_size;
        img->nx = image_size.width;
        img->ny = image_size.height;
        img->buf.resize(image_size.width * image_size.height * 3);
        batch.entries.push_back(std::move(img));

        ggml_cgraph * gf = clip_image_build_graph(&ctx_clip, batch, image_size, false);
        ggml_backend_sched_reserve(ctx_clip.sched.get(), gf);
        for (size_t i = 0; i < ctx_clip.backend_ptrs.size(); ++i) {
            ggml_backend_t backend = ctx_clip.backend_ptrs[i];
            ggml_backend_buffer_type_t buft = ctx_clip.backend_buft[i];
            size_t size = ggml_backend_sched_get_buffer_size(ctx_clip.sched.get(), backend);
            if (size > 1) {
                LOG_INF("%s: %10s compute buffer size = %8.2f MiB\n", __func__,
                        ggml_backend_buft_name(buft),
                        size / 1024.0 / 1024.0);
            }
        }
    }